

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.hh
# Opt level: O3

ostream * tchecker::graph::
          dot_output<tchecker::tck_liveness::zg_ndfs::graph_t,tchecker::tck_liveness::zg_ndfs::node_lexical_less_t,tchecker::tck_liveness::zg_ndfs::edge_lexical_less_t>
                    (ostream *os,graph_t *g,string *name)

{
  _Rb_tree_header *p_Var1;
  make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
  *pmVar2;
  long lVar3;
  bool bVar4;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  iVar5;
  ostream *poVar6;
  char cVar7;
  _Base_ptr p_Var8;
  iterator iVar9;
  iterator iVar10;
  runtime_error *prVar11;
  overflow_error *poVar12;
  make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
  *pmVar13;
  _Hash_node_base *p_Var14;
  flags_t *pfVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  char cVar18;
  string __str;
  edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
  __end0;
  edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
  __begin0;
  multiset<std::tuple<unsigned_long,_unsigned_long,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_extended_edge_le_t,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>_>
  edges_set;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  attr;
  map<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_unsigned_long,_tchecker::tck_liveness::zg_ndfs::node_lexical_less_t,_std::allocator<std::pair<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_unsigned_long>_>_>
  nodes_map;
  string local_138;
  next_edge_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
  local_118;
  graph_t *local_110;
  ostream *local_108;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  local_100;
  string local_f8;
  string *local_d8;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  *local_d0;
  _Hash_node_base *local_c8;
  _Rb_tree<std::tuple<unsigned_long,_unsigned_long,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::tuple<unsigned_long,_unsigned_long,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::_Identity<std::tuple<unsigned_long,_unsigned_long,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>,_extended_edge_le_t,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>_>
  local_c0;
  undefined1 local_90 [8];
  _Rb_tree_node_base local_88;
  size_t local_68;
  _Rb_tree<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::pair<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_unsigned_long>,_std::_Select1st<std::pair<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_unsigned_long>_>,_tchecker::tck_liveness::zg_ndfs::node_lexical_less_t,_std::allocator<std::pair<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_unsigned_long>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var14 = (g->
            super_graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
            )._find_graph._nodes._table._M_h._M_before_begin._M_nxt;
  local_110 = g;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (p_Var14 != (_Hash_node_base *)0x0) {
    do {
      local_c0._M_impl._0_8_ =
           (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
            *)0x0;
      pmVar2 = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                *)p_Var14[1]._M_nxt;
      if ((pmVar2 != (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                      *)0x0) &&
         (pmVar13 = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                     *)((long)&((pmVar2[-1].
                                 super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                                 .
                                 super_node_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                                 .
                                 super_edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                                 ._head._t)->
                               super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                               ).super_edge_t.super_edge_vedge_t._vedge._t + 1),
         pmVar2[-1].
         super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
         .
         super_node_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
         .
         super_edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
         ._head._t = pmVar13,
         pmVar13 ==
         (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
          *)0xfffffffffffffffe)) {
        poVar12 = (overflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error(poVar12,"reference counter overflow");
        __cxa_throw(poVar12,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
      }
      local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_c0._M_impl._0_8_ = pmVar2;
      std::
      _Rb_tree<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,std::pair<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>const,unsigned_long>,std::_Select1st<std::pair<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>const,unsigned_long>>,tchecker::tck_liveness::zg_ndfs::node_lexical_less_t,std::allocator<std::pair<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>const,unsigned_long>>>
      ::
      _M_emplace_unique<std::pair<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,int>>
                ((_Rb_tree<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>,std::pair<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>const,unsigned_long>,std::_Select1st<std::pair<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>const,unsigned_long>>,tchecker::tck_liveness::zg_ndfs::node_lexical_less_t,std::allocator<std::pair<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>const,unsigned_long>>>
                  *)&local_60,
                 (pair<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_int>
                  *)&local_c0);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t
                ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                  *)&local_c0);
      p_Var14 = p_Var14->_M_nxt;
    } while (p_Var14 != (_Hash_node_base *)0x0);
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      p_Var17 = (_Base_ptr)0x0;
      p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        p_Var8[1]._M_parent = p_Var17;
        p_Var17 = (_Base_ptr)(ulong)((int)p_Var17 + 1);
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    }
  }
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var14 = (local_110->
            super_graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
            )._find_graph._nodes._table._M_h._M_before_begin._M_nxt;
  local_108 = os;
  local_d8 = name;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var14 != (_Hash_node_base *)0x0) {
    local_d0 = (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                *)&(local_110->
                   super_graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
                   ).field_0x50;
    do {
      local_c8 = p_Var14;
      directed::
      graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
      ::edges<tchecker::graph::directed::details::outgoing>
                ((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                  *)&local_138,local_d0);
      local_f8._M_dataplus._M_p = (pointer)0x0;
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_138._M_dataplus._M_p !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) &&
         (lVar3 = *(long *)(local_138._M_dataplus._M_p + -8),
         *(long *)(local_138._M_dataplus._M_p + -8) = lVar3 + 1, lVar3 + 1 == -2)) {
        poVar12 = (overflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error(poVar12,"reference counter overflow");
        __cxa_throw(poVar12,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
      }
      local_f8._M_dataplus._M_p = local_138._M_dataplus._M_p;
      local_100._t = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                      *)0x0;
      iVar5._t = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                  *)CONCAT44(local_138._M_string_length._4_4_,(uint)local_138._M_string_length);
      if ((iVar5._t !=
           (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
            *)0x0) &&
         (pfVar15 = &((iVar5._t[-1].
                       super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                       .
                       super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                       .
                       super_edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                       ._node._t)->
                     super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                     ).super_node_t.super_node_t.super_node_flags_t.NODE_FINAL,
         iVar5._t[-1].
         super_edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
         .
         super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
         .
         super_edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
         ._node._t = (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                      *)pfVar15, pfVar15 == (flags_t *)0xfffffffffffffffe)) {
        poVar12 = (overflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error(poVar12,"reference counter overflow");
        __cxa_throw(poVar12,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
      }
      while (local_100._t = iVar5._t,
            (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
             *)local_f8._M_dataplus._M_p != local_100._t) {
        local_118._next._t =
             (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
              )(make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
LAB_0013164f:
          __assert_fail("_t != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                        ,0x1db,
                        "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t, tchecker::tck_liveness::zg_ndfs::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t, tchecker::tck_liveness::zg_ndfs::edge_t>>]"
                       );
        }
        lVar3 = *(long *)(local_f8._M_dataplus._M_p + -8);
        *(long *)(local_f8._M_dataplus._M_p + -8) = lVar3 + 1;
        if (lVar3 + 1 == -2) {
          poVar12 = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(poVar12,"reference counter overflow");
          __cxa_throw(poVar12,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        local_118._next._t =
             (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
              )(intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                )local_f8._M_dataplus._M_p;
        iVar9 = std::
                _Rb_tree<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::pair<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_unsigned_long>,_std::_Select1st<std::pair<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_unsigned_long>_>,_tchecker::tck_liveness::zg_ndfs::node_lexical_less_t,_std::allocator<std::pair<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_unsigned_long>_>_>
                ::find(&local_60,(key_type *)(local_f8._M_dataplus._M_p + 0x20));
        if ((_Rb_tree_header *)iVar9._M_node == p_Var1) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar11,"tchecker::graph::dot_output: source node not found");
          __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (local_118._next._t ==
            (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
             *)0x0) goto LAB_0013164f;
        iVar10 = std::
                 _Rb_tree<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::pair<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_unsigned_long>,_std::_Select1st<std::pair<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_unsigned_long>_>,_tchecker::tck_liveness::zg_ndfs::node_lexical_less_t,_std::allocator<std::pair<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_unsigned_long>_>_>
                 ::find(&local_60,(key_type *)((long)local_118._next._t + 0x18));
        if ((_Rb_tree_header *)iVar10._M_node == p_Var1) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar11,"tchecker::graph::dot_output: target node not found");
          __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        p_Var8 = iVar9._M_node[1]._M_parent;
        p_Var17 = iVar10._M_node[1]._M_parent;
        local_90 = (undefined1  [8])0x0;
        if ((local_118._next._t !=
             (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
              *)0x0) &&
           (pfVar15 = &(((((edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                            *)((long)local_118._next._t + -8))->_node)._t)->
                       super_node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>
                       ).super_node_t.super_node_t.super_node_flags_t.NODE_FINAL,
           (((edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
              *)((long)local_118._next._t + -8))->_node)._t =
                (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>
                 *)pfVar15, pfVar15 == (flags_t *)0xfffffffffffffffe)) {
          poVar12 = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(poVar12,"reference counter overflow");
          __cxa_throw(poVar12,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        local_90 = (undefined1  [8])local_118._next._t;
        local_88._0_8_ = p_Var17;
        local_88._M_parent = p_Var8;
        std::
        _Rb_tree<std::tuple<unsigned_long,unsigned_long,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::tuple<unsigned_long,unsigned_long,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::_Identity<std::tuple<unsigned_long,unsigned_long,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>>,tchecker::graph::dot_output<tchecker::tck_liveness::zg_ndfs::graph_t,tchecker::tck_liveness::zg_ndfs::node_lexical_less_t,tchecker::tck_liveness::zg_ndfs::edge_lexical_less_t>(std::ostream&,tchecker::tck_liveness::zg_ndfs::graph_t_const&,std::__cxx11::string_const&)::extended_edge_le_t,std::allocator<std::tuple<unsigned_long,unsigned_long,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>>>
        ::
        _M_insert_equal<std::tuple<unsigned_long,unsigned_long,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>>
                  ((_Rb_tree<std::tuple<unsigned_long,unsigned_long,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::tuple<unsigned_long,unsigned_long,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>,std::_Identity<std::tuple<unsigned_long,unsigned_long,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>>,tchecker::graph::dot_output<tchecker::tck_liveness::zg_ndfs::graph_t,tchecker::tck_liveness::zg_ndfs::node_lexical_less_t,tchecker::tck_liveness::zg_ndfs::edge_lexical_less_t>(std::ostream&,tchecker::tck_liveness::zg_ndfs::graph_t_const&,std::__cxx11::string_const&)::extended_edge_le_t,std::allocator<std::tuple<unsigned_long,unsigned_long,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,tchecker::tck_liveness::zg_ndfs::edge_t>,unsigned_long,1ul>>>>>
                    *)&local_c0,
                   (tuple<unsigned_long,_unsigned_long,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                    *)local_90);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t
                  ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                    *)local_90);
        intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
        ::~intrusive_shared_ptr_t(&local_118._next);
        directed::
        edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
        ::operator++((edge_iterator_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                      *)&local_f8);
        iVar5._t = local_100._t;
      }
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t(&local_100);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t
                ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                  *)&local_f8);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t
                ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                  *)&local_138._M_string_length);
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t
                ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                  *)&local_138);
      p_Var14 = local_c8->_M_nxt;
    } while (p_Var14 != (_Hash_node_base *)0x0);
  }
  local_88._M_left = &local_88;
  local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
  local_88._M_parent = (_Base_ptr)0x0;
  local_68 = 0;
  local_88._M_right = local_88._M_left;
  dot_output_header(local_108,local_d8);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_90);
      reachability::
      graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
      ::attributes(&local_110->
                    super_graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
                   ,(node_sptr_t *)(p_Var8 + 1),
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_90);
      p_Var17 = p_Var8[1]._M_parent;
      cVar18 = '\x01';
      if ((_Base_ptr)0x9 < p_Var17) {
        p_Var16 = p_Var17;
        cVar7 = '\x04';
        do {
          cVar18 = cVar7;
          if (p_Var16 < (_Base_ptr)0x64) {
            cVar18 = cVar18 + -2;
            goto LAB_00131406;
          }
          if (p_Var16 < (_Base_ptr)0x3e8) {
            cVar18 = cVar18 + -1;
            goto LAB_00131406;
          }
          if (p_Var16 < (_Base_ptr)0x2710) goto LAB_00131406;
          bVar4 = (_Base_ptr)0x1869f < p_Var16;
          p_Var16 = (_Base_ptr)((ulong)p_Var16 / 10000);
          cVar7 = cVar18 + '\x04';
        } while (bVar4);
        cVar18 = cVar18 + '\x01';
      }
LAB_00131406:
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_138,cVar18);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_138._M_dataplus._M_p,(uint)local_138._M_string_length,(unsigned_long)p_Var17)
      ;
      dot_output_node(local_108,&local_138,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  if ((_Rb_tree_header *)local_c0._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_c0._M_impl.super__Rb_tree_header) {
    p_Var8 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_90);
      reachability::
      graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
      ::attributes(&local_110->
                    super_graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
                   ,(edge_sptr_t *)(p_Var8 + 1),
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_90);
      p_Var17 = p_Var8[1]._M_left;
      cVar18 = '\x01';
      if ((_Base_ptr)0x9 < p_Var17) {
        p_Var16 = p_Var17;
        cVar7 = '\x04';
        do {
          cVar18 = cVar7;
          if (p_Var16 < (_Base_ptr)0x64) {
            cVar18 = cVar18 + -2;
            goto LAB_00131503;
          }
          if (p_Var16 < (_Base_ptr)0x3e8) {
            cVar18 = cVar18 + -1;
            goto LAB_00131503;
          }
          if (p_Var16 < (_Base_ptr)0x2710) goto LAB_00131503;
          bVar4 = (_Base_ptr)0x1869f < p_Var16;
          p_Var16 = (_Base_ptr)((ulong)p_Var16 / 10000);
          cVar7 = cVar18 + '\x04';
        } while (bVar4);
        cVar18 = cVar18 + '\x01';
      }
LAB_00131503:
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_138,cVar18);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_138._M_dataplus._M_p,(uint)local_138._M_string_length,(unsigned_long)p_Var17)
      ;
      p_Var17 = p_Var8[1]._M_parent;
      cVar18 = '\x01';
      if ((_Base_ptr)0x9 < p_Var17) {
        p_Var16 = p_Var17;
        cVar7 = '\x04';
        do {
          cVar18 = cVar7;
          if (p_Var16 < (_Base_ptr)0x64) {
            cVar18 = cVar18 + -2;
            goto LAB_0013157c;
          }
          if (p_Var16 < (_Base_ptr)0x3e8) {
            cVar18 = cVar18 + -1;
            goto LAB_0013157c;
          }
          if (p_Var16 < (_Base_ptr)0x2710) goto LAB_0013157c;
          bVar4 = (_Base_ptr)0x1869f < p_Var16;
          p_Var16 = (_Base_ptr)((ulong)p_Var16 / 10000);
          cVar7 = cVar18 + '\x04';
        } while (bVar4);
        cVar18 = cVar18 + '\x01';
      }
LAB_0013157c:
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_f8,cVar18);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_f8._M_dataplus._M_p,(uint)local_f8._M_string_length,(unsigned_long)p_Var17);
      dot_output_edge(local_108,&local_138,&local_f8,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != &local_c0._M_impl.super__Rb_tree_header);
  }
  poVar6 = local_108;
  dot_output_footer(local_108);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_90);
  std::
  _Rb_tree<std::tuple<unsigned_long,_unsigned_long,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::tuple<unsigned_long,_unsigned_long,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::_Identity<std::tuple<unsigned_long,_unsigned_long,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>,_extended_edge_le_t,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::pair<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_unsigned_long>,_std::_Select1st<std::pair<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_unsigned_long>_>,_tchecker::tck_liveness::zg_ndfs::node_lexical_less_t,_std::allocator<std::pair<const_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_60);
  return poVar6;
}

Assistant:

std::ostream & dot_output(std::ostream & os, GRAPH const & g, std::string const & name)
{
  using node_id_t = std::size_t;
  using extended_edge_t = std::tuple<node_id_t, node_id_t, typename GRAPH::edge_sptr_t>; // <src, tgt, edge_sptr>

  // Extend EDGE_LE on triples (src, tgt, edge)
  class extended_edge_le_t : private EDGE_LE {
  public:
    bool operator()(extended_edge_t const & e1, extended_edge_t const & e2) const
    {
      auto && [src1, tgt1, edge_sptr1] = e1;
      auto && [src2, tgt2, edge_sptr2] = e2;
      if (src1 < src2)
        return true;
      else if (src1 > src2)
        return false;
      else if (tgt1 < tgt2)
        return true;
      else if (tgt1 > tgt2)
        return false;
      else
        return EDGE_LE::operator()(edge_sptr1, edge_sptr2);
    }
  };

  // Sort nodes THEN given them an ID (nodes must all be added first)
  std::map<typename GRAPH::node_sptr_t, node_id_t, NODE_LE> nodes_map;
  for (typename GRAPH::node_sptr_t const & n : g.nodes())
    nodes_map.insert(std::make_pair(n, 0));

  tchecker::node_id_t nodes_count = 0;
  for (auto && [n, id] : nodes_map) {
    id = nodes_count;
    ++nodes_count;
  }

  // Sort (extended) edges
  std::multiset<extended_edge_t, extended_edge_le_t> edges_set;
  for (typename GRAPH::node_sptr_t const & n : g.nodes()) {
    for (typename GRAPH::edge_sptr_t const & e : g.outgoing_edges(n)) {
      auto it_src = nodes_map.find(g.edge_src(e));
      if (it_src == nodes_map.end())
        throw std::runtime_error("tchecker::graph::dot_output: source node not found");
      auto it_tgt = nodes_map.find(g.edge_tgt(e));
      if (it_tgt == nodes_map.end())
        throw std::runtime_error("tchecker::graph::dot_output: target node not found");
      node_id_t src = it_src->second;
      node_id_t tgt = it_tgt->second;
      edges_set.insert(std::make_tuple(src, tgt, e));
    }
  }

  // output graph
  std::map<std::string, std::string> attr;

  tchecker::graph::dot_output_header(os, name);

  for (auto && [node, id] : nodes_map) {
    attr.clear();
    g.attributes(node, attr);
    tchecker::graph::dot_output_node(os, std::to_string(id), attr);
  }

  for (auto && [src, tgt, edge] : edges_set) {
    attr.clear();
    g.attributes(edge, attr);
    tchecker::graph::dot_output_edge(os, std::to_string(src), std::to_string(tgt), attr);
  }

  tchecker::graph::dot_output_footer(os);

  return os;
}